

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O2

Transform * randomTransform(Transform *__return_storage_ptr__,RNG *rng)

{
  undefined1 auVar1 [16];
  Transform *pTVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  float fVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar7 [16];
  Vector3f VVar8;
  anon_class_8_1_ba1d750b rt;
  Point2f u;
  anon_class_8_1_ba1d750b local_138;
  Point2f local_130;
  Transform local_128;
  Transform local_a8;
  
  pbrt::Transform::Transform(__return_storage_ptr__);
  local_138.rng = rng;
  FVar3 = pExp(rng,4.0);
  FVar4 = pExp(rng,4.0);
  FVar5 = pExp(rng,4.0);
  pbrt::Scale(&local_128,FVar3,FVar4,FVar5);
  pTVar2 = __return_storage_ptr__;
  pbrt::Transform::operator*(&local_a8,__return_storage_ptr__,&local_128);
  *(undefined8 *)(__return_storage_ptr__->mInv).m[0] = local_a8.mInv.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[0] + 2) = local_a8.mInv.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[1] = local_a8.mInv.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[1] + 2) = local_a8.mInv.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[2] = local_a8.mInv.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[2] + 2) = local_a8.mInv.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = local_a8.mInv.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[3] + 2) = local_a8.mInv.m[3]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[0] = local_a8.m.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[0] + 2) = local_a8.m.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[1] = local_a8.m.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[1] + 2) = local_a8.m.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[2] = local_a8.m.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[2] + 2) = local_a8.m.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[3] = local_a8.m.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = local_a8.m.m[3]._8_8_;
  FVar3 = randomTransform::anon_class_8_1_ba1d750b::operator()(&local_138);
  FVar4 = randomTransform::anon_class_8_1_ba1d750b::operator()(&local_138);
  FVar5 = randomTransform::anon_class_8_1_ba1d750b::operator()(&local_138);
  auVar1._4_4_ = extraout_XMM0_Db;
  auVar1._0_4_ = FVar3;
  auVar1._8_4_ = extraout_XMM0_Dc;
  auVar1._12_4_ = extraout_XMM0_Dd;
  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)FVar4),0x10);
  VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar1._0_8_;
  VVar8.super_Tuple3<pbrt::Vector3,_float>.z = FVar5;
  pbrt::Translate(&local_128,(pbrt *)pTVar2,VVar8);
  pTVar2 = __return_storage_ptr__;
  pbrt::Transform::operator*(&local_a8,__return_storage_ptr__,&local_128);
  *(undefined8 *)(__return_storage_ptr__->mInv).m[0] = local_a8.mInv.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[0] + 2) = local_a8.mInv.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[1] = local_a8.mInv.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[1] + 2) = local_a8.mInv.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[2] = local_a8.mInv.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[2] + 2) = local_a8.mInv.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = local_a8.mInv.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[3] + 2) = local_a8.mInv.m[3]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[0] = local_a8.m.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[0] + 2) = local_a8.m.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[1] = local_a8.m.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[1] + 2) = local_a8.m.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[2] = local_a8.m.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[2] + 2) = local_a8.m.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[3] = local_a8.m.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = local_a8.m.m[3]._8_8_;
  fVar6 = pbrt::RNG::Uniform<float>(rng);
  local_130.super_Tuple2<pbrt::Point2,_float>.y = pbrt::RNG::Uniform<float>(rng);
  local_130.super_Tuple2<pbrt::Point2,_float>.x = fVar6;
  fVar6 = pbrt::RNG::Uniform<float>(rng);
  auVar7._0_8_ = (double)fVar6;
  auVar7._8_8_ = extraout_XMM0_Qb;
  auVar1 = vfmadd213sd_fma(auVar7,ZEXT816(0x4034000000000000),ZEXT816(0xc024000000000000));
  VVar8 = pbrt::SampleUniformSphere(&local_130);
  pbrt::Rotate(&local_128,(pbrt *)pTVar2,(float)(auVar1._0_8_ * 20.0),VVar8);
  pbrt::Transform::operator*(&local_a8,__return_storage_ptr__,&local_128);
  *(undefined8 *)(__return_storage_ptr__->mInv).m[0] = local_a8.mInv.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[0] + 2) = local_a8.mInv.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[1] = local_a8.mInv.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[1] + 2) = local_a8.mInv.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[2] = local_a8.mInv.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[2] + 2) = local_a8.mInv.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = local_a8.mInv.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[3] + 2) = local_a8.mInv.m[3]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[0] = local_a8.m.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[0] + 2) = local_a8.m.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[1] = local_a8.m.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[1] + 2) = local_a8.m.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[2] = local_a8.m.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[2] + 2) = local_a8.m.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[3] = local_a8.m.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = local_a8.m.m[3]._8_8_;
  return __return_storage_ptr__;
}

Assistant:

static Transform randomTransform(RNG &rng) {
    Transform t;
    auto rr = [&rng]() { return -10. + 20. * rng.Uniform<Float>(); };
    auto rt = [&rng]() {
        Float f = pExp(rng);
        return rng.Uniform<Float>() > .5 ? f : -f;
    };

    for (int i = 0; i < 1; ++i) {
        const Float s[3] = {pExp(rng, 4), pExp(rng, 4), pExp(rng, 4)};
        t = t * Scale(s[0], s[1], s[2]);
        t = t * Translate(Vector3f{rt(), rt(), rt()});
        Point2f u{rng.Uniform<Float>(), rng.Uniform<Float>()};
        t = t * Rotate(rr() * 20., SampleUniformSphere(u));
    }
    return t;
}